

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finder.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
::line_start_finder(line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
                    *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_type cVar1;
  char_class_type cVar2;
  undefined6 extraout_var;
  size_t j;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char_type name [8];
  char local_28 [8];
  
  (this->
  super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super_counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .count_.value_ = 0;
  (this->
  super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._vptr_finder = (_func_int **)&PTR__finder_00195ba0;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  lVar3 = 0;
  do {
    cVar1 = cpp_regex_traits<char>::widen(&tr->super_cpp_regex_traits<char>,"newline"[lVar3]);
    local_28[lVar3] = cVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  lVar3 = 0;
  cVar2 = cpp_regex_traits<char>::lookup_classname<char*>
                    (&tr->super_cpp_regex_traits<char>,local_28,local_28 + 7,false);
  auVar4 = ZEXT416((uint)CONCAT62(extraout_var,cVar2));
  auVar4 = pshuflw(auVar4,auVar4,0);
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  do {
    auVar5 = *(undefined1 (*) [16])
              ((tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_ +
              lVar3) & auVar4;
    auVar6._0_2_ = -(ushort)(auVar5._0_2_ == 0);
    auVar6._2_2_ = -(ushort)(auVar5._2_2_ == 0);
    auVar6._4_2_ = -(ushort)(auVar5._4_2_ == 0);
    auVar6._6_2_ = -(ushort)(auVar5._6_2_ == 0);
    auVar6._8_2_ = -(ushort)(auVar5._8_2_ == 0);
    auVar6._10_2_ = -(ushort)(auVar5._10_2_ == 0);
    auVar6._12_2_ = -(ushort)(auVar5._12_2_ == 0);
    auVar6._14_2_ = -(ushort)(auVar5._14_2_ == 0);
    auVar5 = packsswb(auVar6,auVar6);
    *(ulong *)(&(this->
                super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).field_0xc + lVar3) = ~auVar5._0_8_ & 0x101010101010101;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

line_start_finder(Traits const &tr)
    {
        char_class_type newline = lookup_classname(tr, "newline");
        for(int j = 0; j < 256; ++j)
        {
            this->bits_[j] = tr.isctype(static_cast<char_type>(static_cast<unsigned char>(j)), newline);
        }
    }